

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_generator.cpp
# Opt level: O1

LabelId __thiscall
front::irGenerator::irGenerator::LeftValueToLabelId(irGenerator *this,LeftVal *leftVal)

{
  pointer pcVar1;
  LabelId LVar2;
  variant_alternative_t<1UL,_variant<int,_basic_string<char>_>_> *pvVar3;
  variant_alternative_t<0UL,_variant<int,_basic_string<char>_>_> *pvVar4;
  string local_38;
  
  if ((leftVal->
      super__Variant_base<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ).super__Move_assign_alias<int,_std::__cxx11::basic_string<char>_>.
      super__Copy_assign_alias<int,_std::__cxx11::basic_string<char>_>.
      super__Move_ctor_alias<int,_std::__cxx11::basic_string<char>_>.
      super__Copy_ctor_alias<int,_std::__cxx11::basic_string<char>_>.
      super__Variant_storage_alias<int,_std::__cxx11::basic_string<char>_>._M_index == '\0') {
    pvVar4 = std::get<0ul,int,std::__cxx11::string>(leftVal);
    LVar2 = *pvVar4;
  }
  else {
    pvVar3 = std::get<1ul,int,std::__cxx11::string>(leftVal);
    pcVar1 = (pvVar3->_M_dataplus)._M_p;
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_38,pcVar1,pcVar1 + pvVar3->_M_string_length);
    LVar2 = nameToLabelId(this,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return LVar2;
}

Assistant:

LabelId irGenerator::LeftValueToLabelId(LeftVal leftVal) {
  LabelId id;
  switch (leftVal.index()) {
    case 0:
      id = get<LabelId>(leftVal);
      break;
    case 1:
      id = nameToLabelId(get<string>(leftVal));
      break;
  }
  return id;
}